

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

bool __thiscall
ObjectModelBuilder::buildBindingDependency
          (ObjectModelBuilder *this,Binding *binding,string *dep,Object *object,Class *clazz)

{
  string *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pPVar2;
  Property *pPVar3;
  __type _Var4;
  long lVar5;
  ostream *poVar6;
  Property *pPVar7;
  pointer pPVar8;
  bool bVar9;
  bool bVar10;
  undefined1 local_f0 [8];
  Property i;
  Dependency d;
  string dependency;
  
  __return_storage_ptr__ = (string *)(d.objectId.field_2._M_local_buf + 8);
  string_trim(__return_storage_ptr__,dep);
  lVar5 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x11df06);
  i.type.field_2._8_8_ = &d.propertyName._M_string_length;
  d.propertyName._M_dataplus._M_p = (pointer)0x0;
  d.propertyName._M_string_length._0_1_ = 0;
  d.propertyName.field_2._8_8_ = &d.objectId._M_string_length;
  d.objectId._M_dataplus._M_p = (pointer)0x0;
  d.objectId._M_string_length._0_1_ = 0;
  if (lVar5 == -1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"didn\'t find any match..");
    std::endl<char,std::char_traits<char>>(poVar6);
    pPVar8 = (object->clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (object->clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar9 = false;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (d.objectId.field_2._M_local_buf + 8);
    do {
      if (pPVar8 == pPVar2) break;
      Property::Property((Property *)local_f0,pPVar8);
      poVar6 = std::operator<<((ostream *)&std::cout,"looking object, matching ");
      poVar6 = std::operator<<(poVar6,(string *)&i);
      poVar6 = std::operator<<(poVar6,(string *)pbVar1);
      std::endl<char,std::char_traits<char>>(poVar6);
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &i,pbVar1);
      if (_Var4) {
        std::__cxx11::string::_M_assign((string *)(d.propertyName.field_2._M_local_buf + 8));
        bVar9 = true;
        std::__cxx11::string::_M_assign((string *)(i.type.field_2._M_local_buf + 8));
      }
      Property::~Property((Property *)local_f0);
      pPVar8 = pPVar8 + 1;
    } while (!_Var4);
    if (!bVar9) {
      pPVar3 = (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (d.objectId.field_2._M_local_buf + 8);
      for (pPVar7 = (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>.
                    _M_impl.super__Vector_impl_data._M_start; pPVar7 != pPVar3; pPVar7 = pPVar7 + 1)
      {
        Property::Property((Property *)local_f0,pPVar7);
        poVar6 = std::operator<<((ostream *)&std::cout,"looking class, matching ");
        poVar6 = std::operator<<(poVar6,(string *)&i);
        poVar6 = std::operator<<(poVar6,(string *)pbVar1);
        std::endl<char,std::char_traits<char>>(poVar6);
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&i,pbVar1);
        if (_Var4) {
          std::__cxx11::string::assign(d.propertyName.field_2._M_local_buf + 8);
          std::__cxx11::string::_M_assign((string *)(i.type.field_2._M_local_buf + 8));
          Property::~Property((Property *)local_f0);
          break;
        }
        Property::~Property((Property *)local_f0);
      }
    }
  }
  else {
    std::__cxx11::string::substr((ulong)local_f0,(ulong)((long)&d.objectId.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)(d.propertyName.field_2._M_local_buf + 8),(string *)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::substr((ulong)local_f0,(ulong)((long)&d.objectId.field_2 + 8));
    std::__cxx11::string::operator=((string *)(i.type.field_2._M_local_buf + 8),(string *)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
  }
  bVar9 = d.objectId._M_dataplus._M_p != (pointer)0x0;
  bVar10 = d.propertyName._M_dataplus._M_p != (pointer)0x0;
  if (bVar10 && bVar9) {
    std::vector<Binding::Dependency,_std::allocator<Binding::Dependency>_>::push_back
              (&binding->dependencies,(value_type *)((long)&i.type.field_2 + 8));
  }
  Binding::Dependency::~Dependency((Dependency *)((long)&i.type.field_2 + 8));
  std::__cxx11::string::~string((string *)(d.objectId.field_2._M_local_buf + 8));
  return bVar10 && bVar9;
}

Assistant:

bool ObjectModelBuilder::buildBindingDependency(Binding *binding, const std::string &dep, Object *object, Class *clazz)
{
    // parse out "objectId->propertyName" and add as a Binding::Depencency to the Binding
    std::string dependency = string_trim(dep);
    size_t pos = dependency.find("->");

    Binding::Dependency d;

    // If we didn't find a ->, look in the class we're generating to see if the
    // binding matches that..
    if (pos == std::string::npos) {
        std::cout << "didn't find any match.." << std::endl;
        bool propertyInInstance = false;
        for (auto i : object->clazz->properties) {
            std::cout << "looking object, matching " << i.name << dependency << std::endl;
            if (i.name == dependency) {
                propertyInInstance = true;
                d.objectId = object->id;
                d.propertyName = dependency;
                break;
            }
        }
        if (!propertyInInstance) {
            for (auto i : clazz->properties) {
                std::cout << "looking class, matching " << i.name << dependency << std::endl;
                if (i.name == dependency) {
                    d.objectId = "this"; // refers to the instance of the class being generated
                    d.propertyName = dependency;
                    break;
                }
            }
        }
    } else {
        d.objectId = dependency.substr(0, pos);
        d.propertyName = dependency.substr(pos + 2);
    }
    if (d.objectId.empty() || d.propertyName.empty())
        return false;
    binding->dependencies.push_back(d);
    return true;
}